

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

String * __thiscall
capnp::compiler::ValueTranslator::makeTypeName
          (String *__return_storage_ptr__,ValueTranslator *this,Type type)

{
  size_t sVar1;
  uint uVar2;
  Schema schema;
  char *pcVar3;
  char (*in_R8) [2];
  Type type_00;
  char (*local_48) [11];
  anon_union_8_2_eba6ea51_for_Type_5 local_40;
  String local_38;
  
  local_40 = type.field_4;
  local_48 = type._0_8_;
  uVar2 = 0xe;
  if (((undefined1  [16])type & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
    uVar2 = type._0_4_;
  }
  switch(uVar2 & 0xffff) {
  case 0:
    pcVar3 = "Void";
    break;
  case 1:
    pcVar3 = "Bool";
    break;
  case 2:
    pcVar3 = "Int8";
    break;
  case 3:
    pcVar3 = "Int16";
    goto LAB_00135354;
  case 4:
    pcVar3 = "Int32";
    goto LAB_00135354;
  case 5:
    pcVar3 = "Int64";
    goto LAB_00135354;
  case 6:
    pcVar3 = "UInt8";
LAB_00135354:
    kj::str<char_const(&)[6]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [6])local_48);
    return __return_storage_ptr__;
  case 7:
    pcVar3 = "UInt16";
    goto LAB_00135387;
  case 8:
    pcVar3 = "UInt32";
    goto LAB_00135387;
  case 9:
    pcVar3 = "UInt64";
LAB_00135387:
    kj::str<char_const(&)[7]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [7])local_48);
    return __return_storage_ptr__;
  case 10:
    pcVar3 = "Float32";
    goto LAB_00135376;
  case 0xb:
    pcVar3 = "Float64";
LAB_00135376:
    kj::str<char_const(&)[8]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [8])local_48);
    return __return_storage_ptr__;
  case 0xc:
    pcVar3 = "Text";
    break;
  case 0xd:
    pcVar3 = "Data";
    break;
  case 0xe:
    type_00 = (Type)Type::asList((Type *)&local_48);
    makeTypeName(&local_38,this,type_00);
    kj::str<char_const(&)[6],kj::String,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)"List(",(char (*) [6])&local_38,(String *)0x1c4f43,in_R8
              );
    sVar1 = local_38.content.size_;
    pcVar3 = local_38.content.ptr;
    if (local_38.content.ptr == (char *)0x0) {
      return __return_storage_ptr__;
    }
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (*(code *)**(undefined8 **)local_38.content.disposer)
              (local_38.content.disposer,pcVar3,1,sVar1,sVar1,0);
    return __return_storage_ptr__;
  case 0xf:
    schema.raw = (RawBrandedSchema *)Type::asEnum((Type *)&local_48);
    goto LAB_00135326;
  case 0x10:
    schema.raw = (RawBrandedSchema *)Type::asStruct((Type *)&local_48);
    goto LAB_00135326;
  case 0x11:
    schema.raw = (RawBrandedSchema *)Type::asInterface((Type *)&local_48);
LAB_00135326:
    makeNodeName(__return_storage_ptr__,this,schema);
    return __return_storage_ptr__;
  case 0x12:
    kj::str<char_const(&)[11]>(__return_storage_ptr__,(kj *)0x1d4708,local_48);
    return __return_storage_ptr__;
  default:
    kj::_::unreachable();
  }
  kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)pcVar3,(char (*) [5])local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeTypeName(Type type) {
  switch (type.which()) {
    case schema::Type::VOID: return kj::str("Void");
    case schema::Type::BOOL: return kj::str("Bool");
    case schema::Type::INT8: return kj::str("Int8");
    case schema::Type::INT16: return kj::str("Int16");
    case schema::Type::INT32: return kj::str("Int32");
    case schema::Type::INT64: return kj::str("Int64");
    case schema::Type::UINT8: return kj::str("UInt8");
    case schema::Type::UINT16: return kj::str("UInt16");
    case schema::Type::UINT32: return kj::str("UInt32");
    case schema::Type::UINT64: return kj::str("UInt64");
    case schema::Type::FLOAT32: return kj::str("Float32");
    case schema::Type::FLOAT64: return kj::str("Float64");
    case schema::Type::TEXT: return kj::str("Text");
    case schema::Type::DATA: return kj::str("Data");
    case schema::Type::LIST:
      return kj::str("List(", makeTypeName(type.asList().getElementType()), ")");
    case schema::Type::ENUM: return makeNodeName(type.asEnum());
    case schema::Type::STRUCT: return makeNodeName(type.asStruct());
    case schema::Type::INTERFACE: return makeNodeName(type.asInterface());
    case schema::Type::ANY_POINTER: return kj::str("AnyPointer");
  }
  KJ_UNREACHABLE;
}